

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void djb::fresnel::f0_to_ior(float_t f0,float_t *ior)

{
  double dVar1;
  float_t sqrt_f0;
  float_t *ior_local;
  float_t f0_local;
  
  if (ior == (float_t *)0x0) {
    __assert_fail("ior && \"Null output ptr\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x454,"void djb::fresnel::f0_to_ior(float_t, float_t *)");
  }
  if ((f0 != 1.0) || (NAN(f0))) {
    dVar1 = std::sqrt((double)(ulong)(uint)f0);
    *ior = (SUB84(dVar1,0) + 1.0) / (1.0 - SUB84(dVar1,0));
  }
  else {
    *ior = 1.0;
  }
  return;
}

Assistant:

void f0_to_ior(float_t f0, float_t *ior)
{
	DJB_ASSERT(ior && "Null output ptr");
	if (f0 == 1) {
		(*ior) = 1;
	} else {
		float_t sqrt_f0 = sqrt(f0);

		(*ior) = (1 + sqrt_f0) / (1 - sqrt_f0);
	}
}